

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O0

unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
QAbstractFileEngine::create(QString *fileName)

{
  bool bVar1;
  QFileSystemEntry *in_RSI;
  _Head_base<0UL,_QAbstractFileEngine_*,_false> in_RDI;
  long in_FS_OFFSET;
  unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *engine;
  QFileSystemMetaData metaData;
  QFileSystemEntry entry;
  QString *in_stack_ffffffffffffff38;
  QFileSystemMetaData *this;
  uint7 in_stack_ffffffffffffff50;
  undefined1 local_78 [56];
  undefined1 local_40 [56];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QFileSystemMetaData *)in_RDI._M_head_impl;
  memset(local_40,0xaa,0x38);
  QFileSystemEntry::QFileSystemEntry
            ((QFileSystemEntry *)in_RDI._M_head_impl,in_stack_ffffffffffffff38);
  memset(local_78,0xaa,0x38);
  QFileSystemMetaData::QFileSystemMetaData((QFileSystemMetaData *)in_RDI._M_head_impl);
  this->knownFlagsMask = (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0xaaaaaaaa;
  this->entryFlags = (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0xaaaaaaaa;
  QFileSystemEngine::createLegacyEngine
            (in_RSI,(QFileSystemMetaData *)(ulong)in_stack_ffffffffffffff50);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                     0x19133a);
  if (!bVar1) {
    QFileSystemEntry::filePath((QFileSystemEntry *)this);
    std::make_unique<QFSFileEngine,QString>((QString *)this);
    std::unique_ptr<QAbstractFileEngine,std::default_delete<QAbstractFileEngine>>::operator=
              ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
               in_RDI._M_head_impl,
               (unique_ptr<QFSFileEngine,_std::default_delete<QFSFileEngine>_> *)
               in_stack_ffffffffffffff38);
    std::unique_ptr<QFSFileEngine,_std::default_delete<QFSFileEngine>_>::~unique_ptr
              ((unique_ptr<QFSFileEngine,_std::default_delete<QFSFileEngine>_> *)in_RDI._M_head_impl
              );
    QString::~QString((QString *)0x191382);
  }
  QFileSystemEntry::~QFileSystemEntry((QFileSystemEntry *)in_RDI._M_head_impl);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>,_true,_true>
         )(tuple<QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>)
          in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<QAbstractFileEngine> QAbstractFileEngine::create(const QString &fileName)
{
    QFileSystemEntry entry(fileName);
    QFileSystemMetaData metaData;
    auto engine = QFileSystemEngine::createLegacyEngine(entry, metaData);

#ifndef QT_NO_FSFILEENGINE
    if (!engine) // fall back to regular file engine
        engine = std::make_unique<QFSFileEngine>(entry.filePath());
#endif

    return engine;
}